

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# real_valued_fast_fourier_transform.cc
# Opt level: O0

void __thiscall
sptk::RealValuedFastFourierTransform::RealValuedFastFourierTransform
          (RealValuedFastFourierTransform *this,int num_order,int fft_length)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  reference pvVar4;
  undefined4 in_EDX;
  undefined4 in_ESI;
  undefined8 *in_RDI;
  double dVar5;
  double dVar6;
  int i;
  double argument;
  int table_size;
  undefined8 in_stack_ffffffffffffffa8;
  undefined6 in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb6;
  undefined1 in_stack_ffffffffffffffb7;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  int iVar7;
  
  *in_RDI = &PTR__RealValuedFastFourierTransform_00130bf8;
  *(undefined4 *)(in_RDI + 1) = in_ESI;
  *(undefined4 *)((long)in_RDI + 0xc) = in_EDX;
  *(int *)(in_RDI + 2) = *(int *)((long)in_RDI + 0xc) / 2;
  FastFourierTransform::FastFourierTransform
            ((FastFourierTransform *)
             CONCAT17(in_stack_ffffffffffffffb7,
                      CONCAT16(in_stack_ffffffffffffffb6,in_stack_ffffffffffffffb0)),
             (int)((ulong)in_stack_ffffffffffffffa8 >> 0x20));
  *(undefined1 *)(in_RDI + 9) = 1;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x121f87);
  if ((((*(int *)(in_RDI + 1) < 0) || (*(int *)((long)in_RDI + 0xc) <= *(int *)(in_RDI + 1))) ||
      (bVar2 = IsPowerOfTwo(*(int *)((long)in_RDI + 0xc)), !bVar2)) ||
     (bVar2 = FastFourierTransform::IsValid((FastFourierTransform *)(in_RDI + 3)), !bVar2)) {
    *(undefined1 *)(in_RDI + 9) = 0;
  }
  else {
    iVar1 = *(int *)((long)in_RDI + 0xc);
    iVar3 = iVar1;
    if (iVar1 < 0) {
      iVar3 = iVar1 + 3;
    }
    dVar5 = 3.141592653589793 / (double)*(int *)((long)in_RDI + 0xc);
    std::vector<double,_std::allocator<double>_>::resize
              ((vector<double,_std::allocator<double>_> *)
               CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),(size_type)in_RDI);
    for (iVar7 = 0; iVar7 < (iVar1 + 1) - (iVar3 >> 2); iVar7 = iVar7 + 1) {
      dVar6 = sin((dVar5 + dVar5) * (double)iVar7);
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 10),(long)iVar7);
      *pvVar4 = dVar6;
    }
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 10),
                        (long)(*(int *)((long)in_RDI + 0xc) / 2));
    *pvVar4 = 0.0;
  }
  return;
}

Assistant:

RealValuedFastFourierTransform::RealValuedFastFourierTransform(int num_order,
                                                               int fft_length)
    : num_order_(num_order),
      fft_length_(fft_length),
      half_fft_length_(fft_length_ / 2),
      fast_fourier_transform_(half_fft_length_),
      is_valid_(true) {
  if (num_order_ < 0 || fft_length_ <= num_order_ ||
      !sptk::IsPowerOfTwo(fft_length_) || !fast_fourier_transform_.IsValid()) {
    is_valid_ = false;
    return;
  }

  const int table_size(fft_length_ - fft_length_ / 4 + 1);
  const double argument(sptk::kPi / fft_length_ * 2);
  sine_table_.resize(table_size);
  for (int i(0); i < table_size; ++i) {
    sine_table_[i] = std::sin(argument * i);
  }
  sine_table_[fft_length_ / 2] = 0.0;
}